

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O2

bool __thiscall Kernel::RobSubstitution::unify(RobSubstitution *this,TermSpec s,TermSpec t)

{
  BacktrackData **ppBVar1;
  BacktrackData ***pppBVar2;
  BacktrackData **ppBVar3;
  pair<Kernel::TermSpec,_Kernel::TermSpec> *ppVar4;
  undefined8 uVar5;
  TermList TVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  TermSpec *pTVar10;
  socklen_t __len;
  TermList TVar11;
  bool bVar12;
  VarSpec v;
  VarSpec v_00;
  TermSpec dt2;
  TermSpec dt1;
  BacktrackData localBD;
  pair<Kernel::TermSpec,_Kernel::TermSpec> local_158;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
  local_138;
  uint64_t local_108;
  int iStack_100;
  undefined4 uStack_fc;
  uint64_t local_f8;
  int iStack_f0;
  undefined4 uStack_ec;
  TermList local_e8;
  undefined8 uStack_e0;
  TermList local_d8;
  undefined8 uStack_d0;
  pair<Kernel::TermSpec,_Kernel::TermSpec> x;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 uStack_94;
  TermSpec t_local;
  TermSpec s_local;
  StlIter __begin6;
  
  t_local.term = t.term._content;
  s_local.term = s.term._content;
  s_local.index = s.index;
  t_local.index = t.index;
  bVar8 = Kernel::TermSpec::sameTermContent(&s_local,&t_local);
  bVar12 = true;
  if (!bVar8) {
    localBD._boList = (BacktrackObject *)0x0;
    Lib::Stack<Lib::BacktrackData_*>::push((Stack<Lib::BacktrackData_*> *)this,&localBD);
    if ((unify(Kernel::TermSpec,Kernel::TermSpec)::toDo == '\0') &&
       (iVar9 = __cxa_guard_acquire(&unify(Kernel::TermSpec,Kernel::TermSpec)::toDo), iVar9 != 0)) {
      Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::Stack(&unify::toDo,0x40);
      __cxa_atexit(Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::~Stack,&unify::toDo,
                   &__dso_handle);
      __cxa_guard_release(&unify(Kernel::TermSpec,Kernel::TermSpec)::toDo);
    }
    iVar7 = s_local.index;
    TVar6._content = s_local.term._content;
    iVar9 = t_local.index;
    TVar11._content = t_local.term._content;
    if (unify::toDo._cursor == unify::toDo._end) {
      Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::expand(&unify::toDo);
    }
    ppVar4 = unify::toDo._cursor;
    local_a8 = (undefined4)TVar6._content;
    uStack_a4 = (undefined4)(TVar6._content >> 0x20);
    local_98 = (undefined4)TVar11._content;
    uStack_94 = (undefined4)(TVar11._content >> 0x20);
    *(undefined4 *)&((unify::toDo._cursor)->second).term._content = local_98;
    *(undefined4 *)((long)&(ppVar4->second).term._content + 4) = uStack_94;
    (ppVar4->second).index = iVar9;
    *(undefined4 *)&(ppVar4->second).field_0xc = t_local._12_4_;
    *(undefined4 *)&(ppVar4->first).term._content = local_a8;
    *(undefined4 *)((long)&(ppVar4->first).term._content + 4) = uStack_a4;
    (ppVar4->first).index = iVar7;
    *(undefined4 *)&(ppVar4->first).field_0xc = s_local._12_4_;
    unify::toDo._cursor = unify::toDo._cursor + 1;
    if ((unify(Kernel::TermSpec,Kernel::TermSpec)::encountered_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&unify(Kernel::TermSpec,Kernel::TermSpec)::encountered_),
       iVar9 != 0)) {
      unify::encountered_._map._timestamp = 1;
      unify::encountered_._map._size = 0;
      unify::encountered_._map._deleted = 0;
      unify::encountered_._map._capacityIndex = 0;
      unify::encountered_._map._capacity = 0;
      unify::encountered_._map._20_8_ = 0;
      unify::encountered_._map._28_8_ = 0;
      unify::encountered_._map._afterLast._4_4_ = 0;
      __cxa_atexit(Lib::
                   DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>
                   ::~DHSet,&unify::encountered_,&__dso_handle);
      __cxa_guard_release(&unify(Kernel::TermSpec,Kernel::TermSpec)::encountered_);
    }
    Lib::
    DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::reset(&unify::encountered_._map);
    while (bVar12 = unify::toDo._cursor == unify::toDo._stack, !bVar12) {
      x.first.term._content = unify::toDo._cursor[-1].first.term._content;
      x.first.index = unify::toDo._cursor[-1].first.index;
      x.first._12_4_ = *(undefined4 *)&unify::toDo._cursor[-1].first.field_0xc;
      x.second.term._content = unify::toDo._cursor[-1].second.term._content;
      x.second.index = unify::toDo._cursor[-1].second.index;
      x.second._12_4_ = *(undefined4 *)&unify::toDo._cursor[-1].second.field_0xc;
      unify::toDo._cursor = unify::toDo._cursor + -1;
      pTVar10 = derefBound(this,&x.first);
      dt1.term._content = (pTVar10->term)._content;
      dt1.index = pTVar10->index;
      dt1._12_4_ = *(undefined4 *)&pTVar10->field_0xc;
      pTVar10 = derefBound(this,&x.second);
      dt2.term._content = (pTVar10->term)._content;
      dt2.index = pTVar10->index;
      dt2._12_4_ = *(undefined4 *)&pTVar10->field_0xc;
      bVar8 = Kernel::TermSpec::sameTermContent(&dt1,&dt2);
      if (!bVar8) {
        if ((dt1.term._content & 1) == 0) {
LAB_004813f3:
          if ((dt2.term._content & 1) != 0) {
            local_138._iter._func.other._iter._func.this = (TermSpec *)dt2.term._content;
            local_138._iter._func.other._iter._inner._next = dt2.index;
            bVar8 = occurs(this,(VarSpec *)&local_138,&dt1);
            if (!bVar8) {
              local_138._iter._func.other._iter._func.this = (TermSpec *)dt2.term._content;
              local_138._iter._func.other._iter._inner._next = dt2.index;
              TVar11 = dt1.term;
              __len = dt1.index;
              goto LAB_00481619;
            }
          }
          if ((((dt1.term._content & 3) != 0) || ((dt2.term._content & 3) != 0)) ||
             (*(int *)(dt1.term._content + 8) != *(int *)(dt2.term._content + 8))) {
            unify::toDo._cursor = unify::toDo._stack;
            pppBVar2 = &(this->super_Backtrackable)._bdStack._cursor;
            *pppBVar2 = *pppBVar2 + -1;
            Lib::BacktrackData::backtrack(&localBD);
            return bVar12;
          }
          local_138._iter._func.other._iter._func.this = &dt2;
          local_138._iter._func.other._iter._inner._next = 0;
          local_138._iter._func.other._iter._inner._from = 0;
          local_138._iter._inner._inner._to = *(uint *)(dt1.term._content + 0xc) & 0xfffffff;
          local_138._iter._func.other._iter._inner._to =
               *(uint *)(dt2.term._content + 0xc) & 0xfffffff;
          local_138._iter._inner._func.this = &dt1;
          local_138._iter._inner._inner._next = 0;
          local_138._iter._inner._inner._from = 0;
          Lib::
          IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
          ::StlIter::StlIter(&__begin6,&local_138);
          while (__begin6._cur.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                 _isSome != false) {
            local_e8._content =
                 (uint64_t)
                 __begin6._cur.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                 _elem._elem.init.first.term._content;
            uStack_e0 = __begin6._cur.
                        super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem._elem
                        ._8_8_;
            local_d8._content =
                 (uint64_t)
                 __begin6._cur.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                 _elem._elem.init.second.term._content;
            uStack_d0 = __begin6._cur.
                        super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem._elem
                        ._24_8_;
            local_158.first.term._content =
                 (uint64_t)
                 __begin6._cur.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                 _elem._elem.init.first.term._content;
            local_158.first._8_8_ =
                 __begin6._cur.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                 _elem._elem._8_8_;
            uVar5 = local_158.first._8_8_;
            local_158.second.term._content =
                 (uint64_t)
                 __begin6._cur.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                 _elem._elem.init.second.term._content;
            local_158.second._8_8_ =
                 __begin6._cur.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                 _elem._elem._24_8_;
            if (((ulong)__begin6._cur.
                        super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem._elem
                        .init.first.term._content & 1) == 0) {
LAB_00481553:
              bVar8 = Lib::
                      DHSet<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::DefaultHash,_Lib::DefaultHash2>
                      ::find(&unify::encountered_,&local_158);
              if (!bVar8) {
                Lib::
                DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&unify::encountered_._map);
                local_f8 = local_158.second.term._content;
                iStack_f0 = local_158.second.index;
                uStack_ec = local_158.second._12_4_;
                local_108 = local_158.first.term._content;
                iStack_100 = local_158.first.index;
                uStack_fc = local_158.first._12_4_;
                if (unify::toDo._cursor == unify::toDo._end) {
                  Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::expand(&unify::toDo);
                }
                goto LAB_004815ba;
              }
            }
            else {
              local_158.first.index =
                   (int)__begin6._cur.
                        super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem._elem
                        ._8_8_;
              v.index = local_158.first.index;
              v._self._content =
                   (uint64_t)
                   __begin6._cur.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                   _elem._elem.init.first.term._content;
              v._12_4_ = 0;
              local_158.first._8_8_ = uVar5;
              bVar8 = isUnbound(this,v);
              if ((!bVar8) || ((local_158.second.term._content & 1) == 0)) goto LAB_00481553;
              v_00.index = local_158.second.index;
              v_00._self._content = local_158.second.term._content;
              v_00._12_4_ = 0;
              bVar8 = isUnbound(this,v_00);
              if (!bVar8) goto LAB_00481553;
              local_f8 = local_158.second.term._content;
              iStack_f0 = local_158.second.index;
              uStack_ec = local_158.second._12_4_;
              local_108 = local_158.first.term._content;
              iStack_100 = local_158.first.index;
              uStack_fc = local_158.first._12_4_;
              if (unify::toDo._cursor == unify::toDo._end) {
                Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::expand(&unify::toDo);
              }
LAB_004815ba:
              ppVar4 = unify::toDo._cursor;
              ((unify::toDo._cursor)->second).term._content = local_f8;
              (ppVar4->second).index = iStack_f0;
              *(undefined4 *)&(ppVar4->second).field_0xc = uStack_ec;
              (ppVar4->first).term._content = local_108;
              (ppVar4->first).index = iStack_100;
              *(undefined4 *)&(ppVar4->first).field_0xc = uStack_fc;
              unify::toDo._cursor = unify::toDo._cursor + 1;
            }
            Lib::
            IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
            ::StlIter::operator++(&__begin6);
          }
        }
        else {
          local_138._iter._func.other._iter._func.this = (TermSpec *)dt1.term._content;
          local_138._iter._func.other._iter._inner._next = dt1.index;
          bVar8 = occurs(this,(VarSpec *)&local_138,&dt2);
          if (bVar8) goto LAB_004813f3;
          local_138._iter._func.other._iter._func.this = (TermSpec *)dt1.term._content;
          local_138._iter._func.other._iter._inner._next = dt1.index;
          TVar11 = dt2.term;
          __len = dt2.index;
LAB_00481619:
          bind(this,(int)&local_138,(sockaddr *)TVar11._content,__len);
        }
      }
    }
    ppBVar3 = (this->super_Backtrackable)._bdStack._cursor;
    ppBVar1 = ppBVar3 + -1;
    (this->super_Backtrackable)._bdStack._cursor = ppBVar1;
    if ((ppBVar1 != (this->super_Backtrackable)._bdStack._stack) &&
       (ppBVar3[-2] != (BacktrackData *)0x0)) {
      Lib::Backtrackable::bdCommit(&this->super_Backtrackable,&localBD);
    }
    Lib::BacktrackData::drop(&localBD);
  }
  return bVar12;
}

Assistant:

bool RobSubstitution::unify(TermSpec s, TermSpec t)
{
#define DEBUG_UNIFY(lvl, ...) if (lvl < 0) DBG("unify: ", __VA_ARGS__)
  DEBUG_UNIFY(0, *this, ".unify(", s, ",", t, ")")


  if(s.sameTermContent(t)) {
    return true;
  }

  BacktrackData localBD;
  bdRecord(localBD);

  static Stack<pair<TermSpec, TermSpec>> toDo(64);
  ASS(toDo.isEmpty());
  toDo.push(make_pair(std::move(s), std::move(t)));

  // Save encountered unification pairs to avoid
  // recomputing their unification
  static DHSet<pair<TermSpec, TermSpec>> encountered_;
  auto encountered = &encountered_;
  encountered->reset();
  

  auto pushTodo = [&](auto pair) {
      // we unify each subterm pair at most once, to avoid worst-case exponential runtimes
      // in order to safe memory we do ot do this for variables.
      // (Note by joe:  didn't make this decision, but just keeping the implemenntation 
      // working as before. i.e. as described in the paper "Comparing Unification 
      // Algorithms in First-Order Theorem Proving", by Krystof and Andrei)
      if (pair.first.isVar() && isUnbound(pair.first.varSpec()) &&
          pair.second.isVar() && isUnbound(pair.second.varSpec())) {
        toDo.push(std::move(pair));
      } else if (!encountered->find(pair)) {
        encountered->insert(pair);
        toDo.push(std::move(pair));
      }
  };

  bool mismatch=false;
  // Iteratively resolve unification pairs in toDo
  // the current pair is always in t1 and t2 with their dereferenced
  // version in dt1 and dt2
  while (toDo.isNonEmpty()) {
    auto x = toDo.pop();
    TermSpec dt1 = derefBound(x.first);
    TermSpec dt2 = derefBound(x.second);
    DEBUG_UNIFY(1, "next pair: ", tie(dt1, dt2))
    // If they have the same content then skip
    // (note that sameTermContent is best-effort)
    if (dt1.sameTermContent(dt2)) {
    // Deal with the case where eithe rare variables
    // Do an occurs-check and note that the variable 
    // cannot be currently bound as we already dereferenced
    } else if(dt1.isVar() && !occurs(dt1.varSpec(), dt2)) {
      bind(dt1.varSpec(), dt2);

    } else if(dt2.isVar() && !occurs(dt2.varSpec(), dt1)) {
      bind(dt2.varSpec(), dt1);

    } else if(dt1.isTerm() && dt2.isTerm() 
           && dt1.functor() == dt2.functor()) {

      for (auto c : dt1.allArgs().zip(dt2.allArgs())) {
        pushTodo(make_pair(std::move(c.first), std::move(c.second)));
      }

    } else {
      mismatch = true;
      break;
    }

    ASS(!mismatch)
  }

  if(mismatch) {
    toDo.reset();
  }

  bdDone();

  if(mismatch) {
    localBD.backtrack();
  } else {
    if(bdIsRecording()) {
      bdCommit(localBD);
    }
    localBD.drop();
  }

  DEBUG_UNIFY(0, *this)
  return !mismatch;
}